

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O3

SPxId __thiscall
soplex::
SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,int leaveIdx,bool polish)

{
  uint uVar1;
  undefined1 *this_00;
  undefined8 uVar2;
  double dVar3;
  int32_t iVar4;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar5;
  int *idx;
  int *idx_00;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *low;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *upp;
  pointer pBVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Item *pIVar10;
  element_type *peVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  BreakpointSource BVar12;
  undefined1 uVar13;
  bool bVar14;
  int iVar15;
  DataKey DVar19;
  undefined8 uVar20;
  int iVar16;
  fpclass_type fVar17;
  int iVar18;
  pointer pnVar23;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar24;
  undefined8 uVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  undefined4 *puVar29;
  cpp_dec_float<200U,_int,_void> *pcVar30;
  pointer pnVar31;
  pointer pBVar32;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar33;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *v;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar34;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar35;
  cpp_dec_float<200U,_int,_void> *pcVar36;
  uint *puVar37;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar39;
  uint *puVar40;
  pointer pBVar41;
  cpp_dec_float<200U,_int,_void> *pcVar42;
  pointer pnVar43;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar44;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar45;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar46;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar47;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar48;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar49;
  char cVar50;
  ulong uVar51;
  uint uVar52;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar53;
  bool bVar54;
  byte bVar55;
  ulong uVar56;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *low_00;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *low_01;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *upp_00;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *upp_01;
  BreakpointSource BVar57;
  int nBp;
  cpp_dec_float<200U,_int,_void> *local_cd0;
  uint local_cc8;
  uint local_cc4;
  int local_cc0;
  int local_cbc;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ca0;
  SPxId enterId;
  int minIdx;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lowstab;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  undefined1 local_b38 [16];
  undefined1 local_b28 [16];
  undefined1 local_b18 [16];
  undefined1 local_b08 [16];
  undefined1 local_af8 [16];
  undefined1 local_ae8 [16];
  undefined1 local_ad8 [13];
  undefined3 uStack_acb;
  int iStack_ac8;
  bool bStack_ac4;
  undefined8 local_ac0;
  BreakpointCompare local_ab0;
  undefined1 local_aa8 [16];
  undefined1 local_a98 [16];
  undefined1 local_a88 [16];
  undefined1 local_a78 [16];
  undefined1 local_a68 [16];
  undefined1 local_a58 [16];
  undefined1 local_a48 [13];
  undefined3 uStack_a3b;
  int iStack_a38;
  bool bStack_a34;
  undefined8 local_a30;
  cpp_dec_float<200U,_int,_void> *local_a20;
  undefined1 local_a18 [16];
  undefined1 local_a08 [16];
  undefined1 local_9f8 [16];
  undefined1 local_9e8 [16];
  undefined1 local_9d8 [16];
  undefined1 local_9c8 [16];
  undefined1 local_9b8 [13];
  undefined3 uStack_9ab;
  int iStack_9a8;
  bool bStack_9a4;
  undefined8 local_9a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x_1;
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [13];
  undefined3 uStack_8ab;
  int iStack_8a8;
  bool bStack_8a4;
  undefined8 local_8a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  stab;
  cpp_dec_float<200U,_int,_void> local_818;
  undefined1 local_798 [16];
  undefined1 local_788 [16];
  undefined1 local_778 [16];
  undefined1 local_768 [16];
  undefined1 local_758 [16];
  undefined1 local_748 [16];
  undefined1 local_738 [16];
  undefined1 local_728 [16];
  undefined1 local_718 [16];
  undefined1 local_708 [16];
  undefined1 local_6f8 [16];
  undefined1 local_6e8 [16];
  undefined1 local_6d8 [16];
  undefined1 local_6c8 [16];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_630;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_530;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  undefined8 uVar21;
  undefined8 uVar22;
  
  bVar55 = 0;
  iVar16 = ((this->
            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .thesolver)->leaveCount;
  if ((iVar16 * -0x3d70a3d7 + 0x51eb850U >> 2 | iVar16 * 0x40000000) < 0x28f5c29) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)
               &(this->
                super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).field_0x234,1);
  }
  iVar16 = leaveIdx;
  if (((this->
       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).field_0x231 != '\x01' || polish) ||
     (pSVar24 = (this->
                super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .thesolver, iVar16 = leaveIdx, pSVar24->theRep == ROW)) goto LAB_005c46cf;
  this_00 = &(this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).field_0x234;
  local_cbc = leaveIdx;
  if (*(int *)&this->field_0x2ac != 2) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&lowstab.m_backend,0,(type *)0x0);
    iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       ((cpp_dec_float<200U,_int,_void> *)this_00,&lowstab.m_backend);
    iVar16 = local_cbc;
    if (iVar15 < 1) goto LAB_005c46cf;
    pSVar24 = (this->
              super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .thesolver;
  }
  pUVar44 = pSVar24->theCoPvec;
  pUVar5 = pSVar24->thePvec;
  pnVar38 = (pUVar5->
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pnVar46 = (pUVar5->thedelta).
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  idx = (pUVar5->thedelta).super_IdxSet.idx;
  iVar16 = (pUVar5->thedelta).super_IdxSet.num;
  low_01 = (pSVar24->theLbound->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  upp_01 = (pSVar24->theUbound->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar39 = (pUVar44->
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pnVar49 = (pUVar44->thedelta).
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  idx_00 = (pUVar44->thedelta).super_IdxSet.idx;
  local_cb8 = CONCAT44(local_cb8._4_4_,(pUVar44->thedelta).super_IdxSet.num);
  low = (pSVar24->theCoLbound->val).
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  upp = (pSVar24->theCoUbound->val).
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  local_6c8 = (undefined1  [16])0x0;
  local_6d8 = (undefined1  [16])0x0;
  local_6e8 = (undefined1  [16])0x0;
  local_6f8 = (undefined1  [16])0x0;
  local_708 = (undefined1  [16])0x0;
  local_718 = (undefined1  [16])0x0;
  local_728 = (undefined1  [16])0x0;
  local_9a0._0_4_ = cpp_dec_float_finite;
  local_9a0._4_4_ = 0x1c;
  local_a18 = (undefined1  [16])0x0;
  local_a08 = (undefined1  [16])0x0;
  local_9f8 = (undefined1  [16])0x0;
  local_9e8 = (undefined1  [16])0x0;
  local_9d8 = (undefined1  [16])0x0;
  local_9c8 = (undefined1  [16])0x0;
  local_9b8 = SUB1613((undefined1  [16])0x0,0);
  enterId.super_DataKey.info = 0;
  enterId.super_DataKey.idx = -1;
  uStack_9ab = 0;
  iStack_9a8 = 0;
  bStack_9a4 = false;
  local_8a0._0_4_ = cpp_dec_float_finite;
  local_8a0._4_4_ = 0x1c;
  local_918 = (undefined1  [16])0x0;
  local_908 = (undefined1  [16])0x0;
  local_8f8 = (undefined1  [16])0x0;
  local_8e8 = (undefined1  [16])0x0;
  local_8d8 = (undefined1  [16])0x0;
  local_8c8 = (undefined1  [16])0x0;
  local_8b8 = SUB1613((undefined1  [16])0x0,0);
  uStack_8ab = 0;
  iStack_8a8 = 0;
  bStack_8a4 = false;
  local_738 = (undefined1  [16])0x0;
  local_748 = (undefined1  [16])0x0;
  local_758 = (undefined1  [16])0x0;
  local_768 = (undefined1  [16])0x0;
  local_778 = (undefined1  [16])0x0;
  local_788 = (undefined1  [16])0x0;
  local_798 = (undefined1  [16])0x0;
  stab.m_backend.fpclass = cpp_dec_float_finite;
  stab.m_backend.prec_elem = 0x1c;
  stab.m_backend.data._M_elems[0] = 0;
  stab.m_backend.data._M_elems[1] = 0;
  stab.m_backend.data._M_elems[2] = 0;
  stab.m_backend.data._M_elems[3] = 0;
  stab.m_backend.data._M_elems[4] = 0;
  stab.m_backend.data._M_elems[5] = 0;
  stab.m_backend.data._M_elems[6] = 0;
  stab.m_backend.data._M_elems[7] = 0;
  stab.m_backend.data._M_elems[8] = 0;
  stab.m_backend.data._M_elems[9] = 0;
  stab.m_backend.data._M_elems[10] = 0;
  stab.m_backend.data._M_elems[0xb] = 0;
  stab.m_backend.data._M_elems[0xc] = 0;
  stab.m_backend.data._M_elems[0xd] = 0;
  stab.m_backend.data._M_elems[0xe] = 0;
  stab.m_backend.data._M_elems[0xf] = 0;
  stab.m_backend.data._M_elems[0x10] = 0;
  stab.m_backend.data._M_elems[0x11] = 0;
  stab.m_backend.data._M_elems[0x12] = 0;
  stab.m_backend.data._M_elems[0x13] = 0;
  stab.m_backend.data._M_elems[0x14] = 0;
  stab.m_backend.data._M_elems[0x15] = 0;
  stab.m_backend.data._M_elems[0x16] = 0;
  stab.m_backend.data._M_elems[0x17] = 0;
  stab.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
  stab.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  stab.m_backend.exp = 0;
  stab.m_backend.neg = false;
  pnVar34 = val;
  pcVar36 = &local_818;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    (pcVar36->data)._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
    pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar34 + ((ulong)bVar55 * -2 + 1) * 4);
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar55 * -2 + 1) * 4);
  }
  local_818.exp = (val->m_backend).exp;
  local_818.neg = (val->m_backend).neg;
  local_818.fpclass = (val->m_backend).fpclass;
  local_818.prec_elem = (val->m_backend).prec_elem;
  local_ca0 = val;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)val,0.0);
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_a18,0.0);
  nBp = 0;
  minIdx = -1;
  if (local_818.fpclass == cpp_dec_float_NaN) {
LAB_005c46e6:
    collectBreakpointsMin(this,&nBp,&minIdx,idx,iVar16,pnVar46,pnVar38,upp_01,low_01,PVEC);
    collectBreakpointsMin
              (this,&nBp,&minIdx,idx_00,(fpclass_type)local_cb8,pnVar49,pnVar39,upp,low,COPVEC);
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&lowstab.m_backend,0,(type *)0x0);
    iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&local_818,&lowstab.m_backend);
    if (iVar15 < 1) goto LAB_005c46e6;
    collectBreakpointsMax(this,&nBp,&minIdx,idx,iVar16,pnVar46,pnVar38,upp_01,low_01,PVEC);
    collectBreakpointsMax
              (this,&nBp,&minIdx,idx_00,(fpclass_type)local_cb8,pnVar49,pnVar39,upp,low,COPVEC);
  }
  if (nBp == 0) {
    pcVar36 = &local_818;
    pnVar38 = local_ca0;
    for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
      (pnVar38->m_backend).data._M_elems[0] = (pcVar36->data)._M_elems[0];
      pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar55 * -2 + 1) * 4);
      pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar38 + ((ulong)bVar55 * -2 + 1) * 4);
    }
    (local_ca0->m_backend).exp = local_818.exp;
    (local_ca0->m_backend).neg = local_818.neg;
    (local_ca0->m_backend).fpclass = local_818.fpclass;
    (local_ca0->m_backend).prec_elem = local_818.prec_elem;
    uVar25._0_4_ = enterId.super_DataKey.info;
    uVar25._4_4_ = enterId.super_DataKey.idx;
    return (SPxId)uVar25;
  }
  lVar27 = (long)minIdx;
  pBVar6 = (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar32 = pBVar6 + lVar27;
  puVar29 = (undefined4 *)local_728;
  for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
    *puVar29 = *(undefined4 *)&pBVar32->val;
    pBVar32 = (pointer)((long)pBVar32 + ((ulong)bVar55 * -2 + 1) * 4);
    puVar29 = puVar29 + (ulong)bVar55 * -2 + 1;
  }
  iVar16 = *(int *)((long)&pBVar6[lVar27].val.m_backend + 0x70);
  bVar54 = *(bool *)((long)&pBVar6[lVar27].val.m_backend + 0x74);
  iVar15 = pBVar6[lVar27].idx;
  BVar57 = pBVar6[lVar27].src;
  pBVar32 = pBVar6;
  pBVar41 = pBVar6 + lVar27;
  for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
    *(undefined4 *)&pBVar41->val = *(undefined4 *)&(pBVar32->val).m_backend;
    pBVar32 = (pointer)((long)pBVar32 + ((ulong)bVar55 * -2 + 1) * 4);
    pBVar41 = (pointer)((long)pBVar41 + ((ulong)bVar55 * -2 + 1) * 4);
  }
  *(int *)((long)&pBVar6[lVar27].val.m_backend + 0x70) =
       *(int *)((long)&(pBVar6->val).m_backend + 0x70);
  *(bool *)((long)&pBVar6[lVar27].val.m_backend + 0x74) =
       *(bool *)((long)&(pBVar6->val).m_backend + 0x74);
  uVar25 = *(undefined8 *)((long)&(pBVar6->val).m_backend + 0x78);
  BVar12 = pBVar6->src;
  pBVar6[lVar27].idx = pBVar6->idx;
  pBVar6[lVar27].src = BVar12;
  uVar7 = *(undefined8 *)((long)&pBVar6[lVar27].val.m_backend + 0x78);
  *(undefined8 *)((long)&pBVar6[lVar27].val.m_backend + 0x78) = uVar25;
  pBVar6 = (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar29 = (undefined4 *)local_728;
  pBVar32 = pBVar6;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    *(undefined4 *)&(pBVar32->val).m_backend = *puVar29;
    puVar29 = puVar29 + (ulong)bVar55 * -2 + 1;
    pBVar32 = (pointer)((long)pBVar32 + ((ulong)bVar55 * -2 + 1) * 4);
  }
  *(int *)((long)&(pBVar6->val).m_backend + 0x70) = iVar16;
  *(bool *)((long)&(pBVar6->val).m_backend + 0x74) = bVar54;
  *(undefined8 *)((long)&(pBVar6->val).m_backend + 0x78) = uVar7;
  pBVar6->idx = iVar15;
  pBVar6->src = BVar57;
  pnVar23 = (((this->
              super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .thesolver)->theCoTest).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start + local_cbc;
  iVar16 = *(int *)&(pnVar23->m_backend).data;
  puVar40 = (uint *)((long)&(pnVar23->m_backend).data + 4);
  pnVar34 = &lowstab;
  for (lVar27 = 0x1b; lVar27 != 0; lVar27 = lVar27 + -1) {
    (pnVar34->m_backend).data._M_elems[0] = *puVar40;
    puVar40 = puVar40 + (ulong)bVar55 * -2 + 1;
    pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar34 + ((ulong)bVar55 * -2 + 1) * 4);
  }
  iVar15 = (pnVar23->m_backend).exp;
  cVar50 = (pnVar23->m_backend).neg;
  uVar7._0_4_ = (pnVar23->m_backend).fpclass;
  uVar7._4_4_ = (pnVar23->m_backend).prec_elem;
  if ((bool)cVar50 == true) {
    cVar50 = (fpclass_type)uVar7 == cpp_dec_float_finite && iVar16 == 0;
  }
  local_918._0_4_ = iVar16;
  pnVar34 = &lowstab;
  puVar40 = (uint *)(local_918 + 4);
  for (lVar27 = 0x1b; lVar27 != 0; lVar27 = lVar27 + -1) {
    *puVar40 = (pnVar34->m_backend).data._M_elems[0];
    pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar34 + ((ulong)bVar55 * -2 + 1) * 4);
    puVar40 = puVar40 + (ulong)bVar55 * -2 + 1;
  }
  fVar17 = cpp_dec_float_NaN;
  iStack_8a8 = iVar15;
  bStack_8a4 = (bool)cVar50;
  local_8a0 = uVar7;
  if ((fpclass_type)uVar7 != cpp_dec_float_NaN) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&lowstab.m_backend,0,(type *)0x0);
    iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       ((cpp_dec_float<200U,_int,_void> *)local_918,&lowstab.m_backend);
    if (iVar16 == 0) {
      pSVar24 = (this->
                super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .thesolver;
      uVar52 = (pSVar24->instableLeaveVal).m_backend.data._M_elems[0];
      iVar16 = (pSVar24->instableLeaveVal).m_backend.exp;
      cVar50 = (pSVar24->instableLeaveVal).m_backend.neg;
      uVar2._0_4_ = (pSVar24->instableLeaveVal).m_backend.fpclass;
      uVar2._4_4_ = (pSVar24->instableLeaveVal).m_backend.prec_elem;
      if ((bool)cVar50 == true) {
        cVar50 = (fpclass_type)uVar2 == cpp_dec_float_finite && uVar52 == 0;
      }
      local_918._0_4_ = uVar52;
      puVar40 = (pSVar24->instableLeaveVal).m_backend.data._M_elems + 1;
      puVar37 = (uint *)(local_918 + 4);
      for (lVar27 = 0x1b; fVar17 = (fpclass_type)uVar2, iStack_8a8 = iVar16,
          bStack_8a4 = (bool)cVar50, local_8a0 = uVar2, lVar27 != 0; lVar27 = lVar27 + -1) {
        *puVar37 = *puVar40;
        puVar40 = puVar40 + (ulong)bVar55 * -2 + 1;
        puVar37 = puVar37 + (ulong)bVar55 * -2 + 1;
      }
    }
    else {
      fVar17 = (fpclass_type)local_8a0;
    }
  }
  local_ab0.entry =
       (this->breakpoints).data.
       super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_cc8 = 0;
  uVar52 = 0;
  if (nBp < 1) {
    iVar16 = 0;
  }
  else {
    iVar16 = 0;
    uVar52 = 0;
    if (fVar17 != cpp_dec_float_NaN) {
      lVar27 = 0x80;
      iVar16 = 0;
      while( true ) {
        uVar52 = local_cc8;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  (&lowstab.m_backend,0,(type *)0x0);
        iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           ((cpp_dec_float<200U,_int,_void> *)local_918,&lowstab.m_backend);
        if (iVar15 < 1) break;
        if (iVar16 < (int)uVar52) {
          iVar16 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
                             ((this->breakpoints).data.
                              super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                              ._M_impl.super__Vector_impl_data._M_start,&local_ab0,iVar16 + 1,nBp,4,
                              0,0,true);
          local_cb8 = CONCAT44(local_cb8._4_4_,iVar16);
        }
        else {
          local_cb8 = CONCAT44(local_cb8._4_4_,iVar16);
        }
        pBVar6 = (this->breakpoints).data.
                 super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar16 = *(int *)((long)&(pBVar6->val).m_backend + lVar27);
        pSVar24 = (this->
                  super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .thesolver;
        if (*(int *)((long)&(pBVar6->val).m_backend + lVar27 + 4) == 0) {
          if (0 < pSVar24->theRep *
                  ((pSVar24->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thedesc.stat)->data[iVar16]) {
            *(undefined4 *)((long)&(pBVar6->val).m_backend + lVar27) = 0xffffffff;
            pUVar44 = pSVar24->thePvec;
            goto LAB_005c4a91;
          }
          local_cd0 = (cpp_dec_float<200U,_int,_void> *)
                      CONCAT44(local_cd0._4_4_,pnVar46[iVar16].m_backend.exp);
          bVar54 = pnVar46[iVar16].m_backend.neg;
          uVar9._0_4_ = pnVar46[iVar16].m_backend.fpclass;
          uVar9._4_4_ = pnVar46[iVar16].m_backend.prec_elem;
          memmove(&lowstab,pnVar46 + iVar16,0x70);
          lowstab.m_backend.exp = (fpclass_type)local_cd0;
          lowstab.m_backend.neg = bVar54;
          if ((bVar54 == true) &&
             ((fpclass_type)uVar9 != cpp_dec_float_finite || lowstab.m_backend.data._M_elems[0] != 0
             )) {
            lowstab.m_backend.neg = false;
          }
          pcVar36 = &(pSVar24->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .up.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar16].m_backend;
          local_a30._0_4_ = cpp_dec_float_finite;
          local_a30._4_4_ = 0x1c;
          local_aa8 = (undefined1  [16])0x0;
          local_a98 = (undefined1  [16])0x0;
          local_a88 = (undefined1  [16])0x0;
          local_a78 = (undefined1  [16])0x0;
          local_a68 = (undefined1  [16])0x0;
          local_a58 = (undefined1  [16])0x0;
          local_a48 = SUB1613((undefined1  [16])0x0,0);
          uStack_a3b = 0;
          iStack_a38 = 0;
          bStack_a34 = false;
          if ((cpp_dec_float<200U,_int,_void> *)local_aa8 != pcVar36) {
            pcVar30 = pcVar36;
            pcVar42 = (cpp_dec_float<200U,_int,_void> *)local_aa8;
            for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
              (pcVar42->data)._M_elems[0] = (pcVar30->data)._M_elems[0];
              pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar55 * -8 + 4);
              pcVar42 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar42 + (ulong)bVar55 * -8 + 4);
            }
            iStack_a38 = pcVar36->exp;
            bStack_a34 = pcVar36->neg;
            local_a30._0_4_ = pcVar36->fpclass;
            local_a30._4_4_ = pcVar36->prec_elem;
          }
          lowstab.m_backend._120_8_ = uVar9;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)local_aa8,&lowstab.m_backend);
          pnVar23 = (((this->
                      super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .thesolver)->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + iVar16;
          local_ac0._0_4_ = cpp_dec_float_finite;
          local_ac0._4_4_ = 0x1c;
          local_b38 = (undefined1  [16])0x0;
          local_b28 = (undefined1  [16])0x0;
          local_b18 = (undefined1  [16])0x0;
          local_b08 = (undefined1  [16])0x0;
          local_af8 = (undefined1  [16])0x0;
          local_ae8 = (undefined1  [16])0x0;
          local_ad8 = SUB1613((undefined1  [16])0x0,0);
          uStack_acb = 0;
          iStack_ac8 = 0;
          bStack_ac4 = false;
          iVar16 = (fpclass_type)local_cb8;
          if ((pointer)local_b38 != pnVar23) {
            pnVar31 = pnVar23;
            pnVar43 = (pointer)local_b38;
            for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
              (pnVar43->m_backend).data._M_elems[0] = (pnVar31->m_backend).data._M_elems[0];
              pnVar31 = (pointer)((long)pnVar31 + ((ulong)bVar55 * -2 + 1) * 4);
              pnVar43 = (pointer)((long)pnVar43 + ((ulong)bVar55 * -2 + 1) * 4);
            }
            iStack_ac8 = (pnVar23->m_backend).exp;
            bStack_ac4 = (pnVar23->m_backend).neg;
            local_ac0._0_4_ = (pnVar23->m_backend).fpclass;
            local_ac0._4_4_ = (pnVar23->m_backend).prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)local_b38,&lowstab.m_backend);
          puVar40 = (uint *)local_aa8;
          pcVar36 = &result_1.m_backend;
          for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
            (pcVar36->data)._M_elems[0] = *puVar40;
            puVar40 = puVar40 + (ulong)bVar55 * -2 + 1;
            pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar55 * -8 + 4);
          }
          result_1.m_backend.exp = iStack_a38;
          result_1.m_backend.neg = bStack_a34;
          result_1.m_backend.fpclass = (fpclass_type)local_a30;
          result_1.m_backend.prec_elem = local_a30._4_4_;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&result_1.m_backend,(cpp_dec_float<200U,_int,_void> *)local_b38);
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_918,&result_1.m_backend);
          if (lowstab.m_backend.fpclass != cpp_dec_float_NaN) {
            goto joined_r0x005c4f6d;
          }
        }
        else if (pSVar24->theRep *
                 ((pSVar24->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.costat)->data[iVar16] < 1) {
          local_cd0 = (cpp_dec_float<200U,_int,_void> *)
                      CONCAT44(local_cd0._4_4_,pnVar49[iVar16].m_backend.exp);
          bVar54 = pnVar49[iVar16].m_backend.neg;
          uVar8._0_4_ = pnVar49[iVar16].m_backend.fpclass;
          uVar8._4_4_ = pnVar49[iVar16].m_backend.prec_elem;
          memmove(&lowstab,pnVar49 + iVar16,0x70);
          lowstab.m_backend.exp = (fpclass_type)local_cd0;
          lowstab.m_backend.neg = bVar54;
          if ((bVar54 == true) &&
             ((fpclass_type)uVar8 != cpp_dec_float_finite || lowstab.m_backend.data._M_elems[0] != 0
             )) {
            lowstab.m_backend.neg = false;
          }
          pcVar36 = &(pSVar24->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .right.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar16].m_backend;
          local_a30._0_4_ = cpp_dec_float_finite;
          local_a30._4_4_ = 0x1c;
          local_aa8 = (undefined1  [16])0x0;
          local_a98 = (undefined1  [16])0x0;
          local_a88 = (undefined1  [16])0x0;
          local_a78 = (undefined1  [16])0x0;
          local_a68 = (undefined1  [16])0x0;
          local_a58 = (undefined1  [16])0x0;
          local_a48 = SUB1613((undefined1  [16])0x0,0);
          uStack_a3b = 0;
          iStack_a38 = 0;
          bStack_a34 = false;
          if ((cpp_dec_float<200U,_int,_void> *)local_aa8 != pcVar36) {
            pcVar30 = pcVar36;
            pcVar42 = (cpp_dec_float<200U,_int,_void> *)local_aa8;
            for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
              (pcVar42->data)._M_elems[0] = (pcVar30->data)._M_elems[0];
              pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar55 * -8 + 4);
              pcVar42 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar42 + (ulong)bVar55 * -8 + 4);
            }
            iStack_a38 = pcVar36->exp;
            bStack_a34 = pcVar36->neg;
            local_a30._0_4_ = pcVar36->fpclass;
            local_a30._4_4_ = pcVar36->prec_elem;
          }
          lowstab.m_backend._120_8_ = uVar8;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)local_aa8,&lowstab.m_backend);
          pnVar23 = (((this->
                      super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .thesolver)->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .left.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + iVar16;
          local_ac0._0_4_ = cpp_dec_float_finite;
          local_ac0._4_4_ = 0x1c;
          local_b38 = (undefined1  [16])0x0;
          local_b28 = (undefined1  [16])0x0;
          local_b18 = (undefined1  [16])0x0;
          local_b08 = (undefined1  [16])0x0;
          local_af8 = (undefined1  [16])0x0;
          local_ae8 = (undefined1  [16])0x0;
          local_ad8 = SUB1613((undefined1  [16])0x0,0);
          uStack_acb = 0;
          iStack_ac8 = 0;
          bStack_ac4 = false;
          iVar16 = (fpclass_type)local_cb8;
          if ((pointer)local_b38 != pnVar23) {
            pnVar31 = pnVar23;
            pnVar43 = (pointer)local_b38;
            for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
              (pnVar43->m_backend).data._M_elems[0] = (pnVar31->m_backend).data._M_elems[0];
              pnVar31 = (pointer)((long)pnVar31 + ((ulong)bVar55 * -2 + 1) * 4);
              pnVar43 = (pointer)((long)pnVar43 + ((ulong)bVar55 * -2 + 1) * 4);
            }
            iStack_ac8 = (pnVar23->m_backend).exp;
            bStack_ac4 = (pnVar23->m_backend).neg;
            local_ac0._0_4_ = (pnVar23->m_backend).fpclass;
            local_ac0._4_4_ = (pnVar23->m_backend).prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)local_b38,&lowstab.m_backend);
          puVar40 = (uint *)local_aa8;
          pcVar36 = &result_1.m_backend;
          for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
            (pcVar36->data)._M_elems[0] = *puVar40;
            puVar40 = puVar40 + (ulong)bVar55 * -2 + 1;
            pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar55 * -8 + 4);
          }
          result_1.m_backend.exp = iStack_a38;
          result_1.m_backend.neg = bStack_a34;
          result_1.m_backend.fpclass = (fpclass_type)local_a30;
          result_1.m_backend.prec_elem = local_a30._4_4_;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&result_1.m_backend,(cpp_dec_float<200U,_int,_void> *)local_b38);
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_918,&result_1.m_backend);
          if (lowstab.m_backend.fpclass != cpp_dec_float_NaN) {
joined_r0x005c4f6d:
            if (((fpclass_type)local_9a0 != cpp_dec_float_NaN) &&
               (iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&lowstab.m_backend,(cpp_dec_float<200U,_int,_void> *)local_a18),
               0 < iVar15)) {
              pnVar34 = &lowstab;
              puVar40 = (uint *)local_a18;
              for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
                *puVar40 = (pnVar34->m_backend).data._M_elems[0];
                pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar34 + ((ulong)bVar55 * -2 + 1) * 4);
                puVar40 = puVar40 + (ulong)bVar55 * -2 + 1;
              }
              iStack_9a8 = lowstab.m_backend.exp;
              bStack_9a4 = lowstab.m_backend.neg;
              local_9a0._0_4_ = lowstab.m_backend.fpclass;
              local_9a0._4_4_ = lowstab.m_backend.prec_elem;
            }
          }
        }
        else {
          *(undefined4 *)((long)&(pBVar6->val).m_backend + lVar27) = 0xffffffff;
          pUVar44 = pSVar24->theCoPvec;
LAB_005c4a91:
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::clearIdx(&pUVar44->thedelta,iVar16);
          iVar16 = (fpclass_type)local_cb8;
        }
        uVar52 = uVar52 + 1;
        fVar17 = (fpclass_type)local_8a0;
        if ((nBp <= (int)uVar52) ||
           (lVar27 = lVar27 + 0x88, local_cc8 = uVar52, (fpclass_type)local_8a0 == cpp_dec_float_NaN
           )) goto LAB_005c4ffe;
      }
      fVar17 = (fpclass_type)local_8a0;
    }
  }
LAB_005c4ffe:
  uVar1 = uVar52 - 1;
  uVar56 = (ulong)uVar1;
  local_cd0 = &(this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .delta.m_backend;
  local_cc8 = uVar1;
  if ((fVar17 != cpp_dec_float_NaN) &&
     (((this->
       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .delta.m_backend.fpclass != cpp_dec_float_NaN &&
      (iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)local_918,local_cd0),
      nBp <= (int)uVar52 && 0 < iVar15)))) {
    lowstab.m_backend.fpclass = cpp_dec_float_finite;
    lowstab.m_backend.prec_elem = 0x1c;
    lowstab.m_backend.data._M_elems[0] = 0;
    lowstab.m_backend.data._M_elems[1] = 0;
    lowstab.m_backend.data._M_elems[2] = 0;
    lowstab.m_backend.data._M_elems[3] = 0;
    lowstab.m_backend.data._M_elems[4] = 0;
    lowstab.m_backend.data._M_elems[5] = 0;
    lowstab.m_backend.data._M_elems[6] = 0;
    lowstab.m_backend.data._M_elems[7] = 0;
    lowstab.m_backend.data._M_elems[8] = 0;
    lowstab.m_backend.data._M_elems[9] = 0;
    lowstab.m_backend.data._M_elems[10] = 0;
    lowstab.m_backend.data._M_elems[0xb] = 0;
    lowstab.m_backend.data._M_elems[0xc] = 0;
    lowstab.m_backend.data._M_elems[0xd] = 0;
    lowstab.m_backend.data._M_elems[0xe] = 0;
    lowstab.m_backend.data._M_elems[0xf] = 0;
    lowstab.m_backend.data._M_elems[0x10] = 0;
    lowstab.m_backend.data._M_elems[0x11] = 0;
    lowstab.m_backend.data._M_elems[0x12] = 0;
    lowstab.m_backend.data._M_elems[0x13] = 0;
    lowstab.m_backend.data._M_elems[0x14] = 0;
    lowstab.m_backend.data._M_elems[0x15] = 0;
    lowstab.m_backend.data._M_elems[0x16] = 0;
    lowstab.m_backend.data._M_elems[0x17] = 0;
    lowstab.m_backend.data._M_elems[0x18] = 0;
    lowstab.m_backend.data._M_elems[0x19] = 0;
    lowstab.m_backend.data._M_elems._104_5_ = 0;
    lowstab.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    lowstab.m_backend.exp = 0;
    lowstab.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&lowstab.m_backend,0.5);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
              ((cpp_dec_float<200U,_int,_void> *)this_00,&lowstab.m_backend);
    pcVar36 = &local_818;
    pnVar38 = local_ca0;
    for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
      (pnVar38->m_backend).data._M_elems[0] = (pcVar36->data)._M_elems[0];
      pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar55 * -2 + 1) * 4);
      pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar38 + ((ulong)bVar55 * -2 + 1) * 4);
    }
    (local_ca0->m_backend).exp = local_818.exp;
    (local_ca0->m_backend).neg = local_818.neg;
    (local_ca0->m_backend).fpclass = local_818.fpclass;
    (local_ca0->m_backend).prec_elem = local_818.prec_elem;
    polish = false;
    val = local_ca0;
    iVar16 = local_cbc;
LAB_005c46cf:
    DVar19 = (DataKey)SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::selectEnter(&this->
                                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ,val,iVar16,polish);
    uVar22._0_4_ = DVar19.info;
    uVar22._4_4_ = DVar19.idx;
    return (SPxId)uVar22;
  }
  lVar28 = (long)(int)uVar1;
  pBVar6 = (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar32 = pBVar6 + lVar28;
  puVar29 = (undefined4 *)local_aa8;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    *puVar29 = *(undefined4 *)&(pBVar32->val).m_backend;
    pBVar32 = (pointer)((long)pBVar32 + ((ulong)bVar55 * -2 + 1) * 4);
    puVar29 = puVar29 + (ulong)bVar55 * -2 + 1;
  }
  iStack_a38 = *(int *)((long)&pBVar6[lVar28].val.m_backend + 0x70);
  bStack_a34 = *(bool *)((long)&pBVar6[lVar28].val.m_backend + 0x74);
  local_a30 = *(undefined8 *)((long)&pBVar6[lVar28].val.m_backend + 0x78);
  local_cc4 = 0xffffffff;
  if ((int)uVar52 < nBp) {
    uVar51 = lVar28 + 1;
    local_cc4 = 0xffffffff;
    do {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                ((cpp_dec_float<200U,_int,_void> *)local_b38,0,(type *)0x0);
      if (iVar16 <= (int)uVar56) {
        iVar16 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
                           ((this->breakpoints).data.
                            super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                            ._M_impl.super__Vector_impl_data._M_start,&local_ab0,iVar16 + 1,nBp,4,0,
                            0,true);
      }
      pBVar6 = (this->breakpoints).data.
               super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar15 = pBVar6[uVar51].idx;
      pSVar24 = (this->
                super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .thesolver;
      pcVar36 = local_cd0;
      if (pBVar6[uVar51].src == PVEC) {
        if (0 < pSVar24->theRep *
                ((pSVar24->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thedesc.stat)->data[iVar15]) {
          pBVar6[uVar51].idx = -1;
          pUVar44 = pSVar24->thePvec;
          goto LAB_005c5222;
        }
        pnVar34 = pnVar46 + iVar15;
        pnVar35 = &x_1;
        for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
          (pnVar35->m_backend).data._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
          pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar34 + ((ulong)bVar55 * -2 + 1) * 4);
          pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar35 + ((ulong)bVar55 * -2 + 1) * 4);
        }
        iVar18 = pnVar46[iVar15].m_backend.exp;
        x_1.m_backend.exp = iVar18;
        bVar54 = pnVar46[iVar15].m_backend.neg;
        x_1.m_backend.neg = bVar54;
        fVar17 = pnVar46[iVar15].m_backend.fpclass;
        iVar4 = pnVar46[iVar15].m_backend.prec_elem;
        x_1.m_backend.prec_elem = iVar4;
        x_1.m_backend.fpclass = fVar17;
        pnVar34 = &x_1;
        pcVar30 = &lowstab.m_backend;
        for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
          (pcVar30->data)._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
          pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar34 + ((ulong)bVar55 * -2 + 1) * 4);
          pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar55 * -8 + 4);
        }
        lowstab.m_backend.prec_elem = iVar4;
        lowstab.m_backend.fpclass = fVar17;
        lowstab.m_backend.neg = bVar54;
        if ((bVar54 == true) &&
           (lowstab.m_backend.data._M_elems[0] != 0 || fVar17 != cpp_dec_float_finite)) {
          lowstab.m_backend.neg = false;
        }
        if (((fVar17 != cpp_dec_float_NaN) &&
            (bVar54 = (fpclass_type)local_9a0 != cpp_dec_float_NaN, bVar54)) &&
           (lowstab.m_backend.exp = iVar18,
           iVar18 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&lowstab.m_backend,(cpp_dec_float<200U,_int,_void> *)local_a18),
           pcVar36 = local_cd0, 0 < iVar18)) {
          local_cb8 = CONCAT44(local_cb8._4_4_,iVar16);
          pSVar24 = (this->
                    super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .thesolver;
          pIVar10 = (pSVar24->thevectors->set).theitem;
          iVar16 = (pSVar24->thevectors->set).thekey[iVar15].idx;
          pUVar44 = pSVar24->theCoPvec;
          lowstab.m_backend.fpclass = cpp_dec_float_finite;
          lowstab.m_backend.prec_elem = 0x1c;
          lowstab.m_backend.data._M_elems[0] = 0;
          lowstab.m_backend.data._M_elems[1] = 0;
          lowstab.m_backend.data._M_elems[2] = 0;
          lowstab.m_backend.data._M_elems[3] = 0;
          lowstab.m_backend.data._M_elems[4] = 0;
          lowstab.m_backend.data._M_elems[5] = 0;
          lowstab.m_backend.data._M_elems[6] = 0;
          lowstab.m_backend.data._M_elems[7] = 0;
          lowstab.m_backend.data._M_elems[8] = 0;
          lowstab.m_backend.data._M_elems[9] = 0;
          lowstab.m_backend.data._M_elems[10] = 0;
          lowstab.m_backend.data._M_elems[0xb] = 0;
          lowstab.m_backend.data._M_elems[0xc] = 0;
          lowstab.m_backend.data._M_elems[0xd] = 0;
          lowstab.m_backend.data._M_elems[0xe] = 0;
          lowstab.m_backend.data._M_elems[0xf] = 0;
          lowstab.m_backend.data._M_elems[0x10] = 0;
          lowstab.m_backend.data._M_elems[0x11] = 0;
          lowstab.m_backend.data._M_elems[0x12] = 0;
          lowstab.m_backend.data._M_elems[0x13] = 0;
          lowstab.m_backend.data._M_elems[0x14] = 0;
          lowstab.m_backend.data._M_elems[0x15] = 0;
          lowstab.m_backend.data._M_elems[0x16] = 0;
          lowstab.m_backend.data._M_elems[0x17] = 0;
          lowstab.m_backend.data._M_elems[0x18] = 0;
          lowstab.m_backend.data._M_elems[0x19] = 0;
          lowstab.m_backend.data._M_elems._104_5_ = 0;
          lowstab.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          lowstab.m_backend.exp = 0;
          lowstab.m_backend.neg = false;
          iVar18 = pIVar10[iVar16].data.
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .memused;
          if (0 < iVar18) {
            pNVar53 = pIVar10[iVar16].data.
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .m_elem;
            uVar52 = iVar18 + 1;
            do {
              pNVar33 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)((pUVar44->
                            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + pNVar53->idx);
              result_1.m_backend.fpclass = cpp_dec_float_finite;
              result_1.m_backend.prec_elem = 0x1c;
              result_1.m_backend.data._M_elems[0] = 0;
              result_1.m_backend.data._M_elems[1] = 0;
              result_1.m_backend.data._M_elems[2] = 0;
              result_1.m_backend.data._M_elems[3] = 0;
              result_1.m_backend.data._M_elems[4] = 0;
              result_1.m_backend.data._M_elems[5] = 0;
              result_1.m_backend.data._M_elems[6] = 0;
              result_1.m_backend.data._M_elems[7] = 0;
              result_1.m_backend.data._M_elems[8] = 0;
              result_1.m_backend.data._M_elems[9] = 0;
              result_1.m_backend.data._M_elems[10] = 0;
              result_1.m_backend.data._M_elems[0xb] = 0;
              result_1.m_backend.data._M_elems[0xc] = 0;
              result_1.m_backend.data._M_elems[0xd] = 0;
              result_1.m_backend.data._M_elems[0xe] = 0;
              result_1.m_backend.data._M_elems[0xf] = 0;
              result_1.m_backend.data._M_elems[0x10] = 0;
              result_1.m_backend.data._M_elems[0x11] = 0;
              result_1.m_backend.data._M_elems[0x12] = 0;
              result_1.m_backend.data._M_elems[0x13] = 0;
              result_1.m_backend.data._M_elems[0x14] = 0;
              result_1.m_backend.data._M_elems[0x15] = 0;
              result_1.m_backend.data._M_elems[0x16] = 0;
              result_1.m_backend.data._M_elems[0x17] = 0;
              result_1.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
              result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result_1.m_backend.exp = 0;
              result_1.m_backend.neg = false;
              v = pNVar53;
              if (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)&result_1 != pNVar33) &&
                 (v = pNVar33,
                 pNVar53 !=
                 (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)&result_1)) {
                pNVar33 = pNVar53;
                pNVar45 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)&result_1;
                for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
                  (pNVar45->val).m_backend.data._M_elems[0] =
                       (pNVar33->val).m_backend.data._M_elems[0];
                  pNVar33 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)((long)pNVar33 + (ulong)bVar55 * -8 + 4);
                  pNVar45 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)((long)pNVar45 + (ulong)bVar55 * -8 + 4);
                }
                result_1.m_backend.exp = (pNVar53->val).m_backend.exp;
                result_1.m_backend.neg = (pNVar53->val).m_backend.neg;
                result_1.m_backend.fpclass = (pNVar53->val).m_backend.fpclass;
                result_1.m_backend.prec_elem = (pNVar53->val).m_backend.prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        ((cpp_dec_float<200U,_int,_void> *)&result_1,
                         (cpp_dec_float<200U,_int,_void> *)v);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        (&lowstab.m_backend,&result_1.m_backend);
              pNVar53 = pNVar53 + 1;
              uVar52 = uVar52 - 1;
            } while (1 < uVar52);
            pSVar24 = (this->
                      super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .thesolver;
          }
          pcVar36 = &lowstab.m_backend;
          pnVar34 = &result_1;
          for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
            (pnVar34->m_backend).data._M_elems[0] = (pcVar36->data)._M_elems[0];
            pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar55 * -8 + 4);
            pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar34 + ((ulong)bVar55 * -2 + 1) * 4);
          }
          pnVar23 = (pSVar24->thePvec->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pnVar34 = &result_1;
          pnVar31 = pnVar23 + iVar15;
          for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
            *(uint *)&pnVar31->m_backend = (pnVar34->m_backend).data._M_elems[0];
            pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar34 + ((ulong)bVar55 * -2 + 1) * 4);
            pnVar31 = (pointer)((long)pnVar31 + ((ulong)bVar55 * -2 + 1) * 4);
          }
          *(int *)((long)(pnVar23 + iVar15) + 0x70) = lowstab.m_backend.exp;
          *(bool *)((long)(pnVar23 + iVar15) + 0x74) = lowstab.m_backend.neg;
          *(undefined8 *)((long)(pnVar23 + iVar15) + 0x78) = lowstab.m_backend._120_8_;
          iVar16 = (fpclass_type)local_cb8;
          pnVar34 = low_01;
          if (x_1.m_backend.fpclass != cpp_dec_float_NaN) {
            lowstab.m_backend.fpclass = cpp_dec_float_finite;
            lowstab.m_backend.prec_elem = 0x1c;
            lowstab.m_backend.data._M_elems[0] = 0;
            lowstab.m_backend.data._M_elems[1] = 0;
            lowstab.m_backend.data._M_elems[2] = 0;
            lowstab.m_backend.data._M_elems[3] = 0;
            lowstab.m_backend.data._M_elems[4] = 0;
            lowstab.m_backend.data._M_elems[5] = 0;
            lowstab.m_backend.data._M_elems[6] = 0;
            lowstab.m_backend.data._M_elems[7] = 0;
            lowstab.m_backend.data._M_elems[8] = 0;
            lowstab.m_backend.data._M_elems[9] = 0;
            lowstab.m_backend.data._M_elems[10] = 0;
            lowstab.m_backend.data._M_elems[0xb] = 0;
            lowstab.m_backend.data._M_elems[0xc] = 0;
            lowstab.m_backend.data._M_elems[0xd] = 0;
            lowstab.m_backend.data._M_elems[0xe] = 0;
            lowstab.m_backend.data._M_elems[0xf] = 0;
            lowstab.m_backend.data._M_elems[0x10] = 0;
            lowstab.m_backend.data._M_elems[0x11] = 0;
            lowstab.m_backend.data._M_elems[0x12] = 0;
            lowstab.m_backend.data._M_elems[0x13] = 0;
            lowstab.m_backend.data._M_elems[0x14] = 0;
            lowstab.m_backend.data._M_elems[0x15] = 0;
            lowstab.m_backend.data._M_elems[0x16] = 0;
            lowstab.m_backend.data._M_elems[0x17] = 0;
            lowstab.m_backend.data._M_elems[0x18] = 0;
            lowstab.m_backend.data._M_elems[0x19] = 0;
            lowstab.m_backend.data._M_elems._104_5_ = 0;
            lowstab.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            lowstab.m_backend.exp = 0;
            lowstab.m_backend.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&lowstab.m_backend,0.0);
            iVar18 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&x_1.m_backend,&lowstab.m_backend);
            if (0 < iVar18) {
              pnVar34 = upp_01;
            }
          }
          pnVar35 = pnVar34 + iVar15;
          pcVar36 = (cpp_dec_float<200U,_int,_void> *)local_b38;
          for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
            (pcVar36->data)._M_elems[0] = (pnVar35->m_backend).data._M_elems[0];
            pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar35 + ((ulong)bVar55 * -2 + 1) * 4);
            pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar55 * -8 + 4);
          }
          iVar18 = pnVar34[iVar15].m_backend.exp;
          iStack_ac8 = iVar18;
          bVar54 = pnVar34[iVar15].m_backend.neg;
          bStack_ac4 = bVar54;
          fVar17 = pnVar34[iVar15].m_backend.fpclass;
          iVar4 = pnVar34[iVar15].m_backend.prec_elem;
          local_ac0._4_4_ = iVar4;
          local_ac0._0_4_ = fVar17;
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x1c;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems[0xe] = 0;
          result_1.m_backend.data._M_elems[0xf] = 0;
          result_1.m_backend.data._M_elems[0x10] = 0;
          result_1.m_backend.data._M_elems[0x11] = 0;
          result_1.m_backend.data._M_elems[0x12] = 0;
          result_1.m_backend.data._M_elems[0x13] = 0;
          result_1.m_backend.data._M_elems[0x14] = 0;
          result_1.m_backend.data._M_elems[0x15] = 0;
          result_1.m_backend.data._M_elems[0x16] = 0;
          result_1.m_backend.data._M_elems[0x17] = 0;
          result_1.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
          result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          if (&result_1.m_backend == &pnVar38[iVar15].m_backend) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&result_1.m_backend,(cpp_dec_float<200U,_int,_void> *)local_b38);
            if (result_1.m_backend.data._M_elems[0] != 0 ||
                result_1.m_backend.fpclass != cpp_dec_float_finite) {
              result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
            }
          }
          else {
            pcVar36 = (cpp_dec_float<200U,_int,_void> *)local_b38;
            pcVar30 = &result_1.m_backend;
            for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pcVar30->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
              pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar55 * -8 + 4);
              pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar55 * -8 + 4);
            }
            result_1.m_backend.prec_elem = iVar4;
            result_1.m_backend.fpclass = fVar17;
            result_1.m_backend.exp = iVar18;
            result_1.m_backend.neg = bVar54;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&result_1.m_backend,&pnVar38[iVar15].m_backend);
          }
          lowstab.m_backend.fpclass = cpp_dec_float_finite;
          lowstab.m_backend.prec_elem = 0x1c;
          lowstab.m_backend.data._M_elems[0] = 0;
          lowstab.m_backend.data._M_elems[1] = 0;
          lowstab.m_backend.data._M_elems[2] = 0;
          lowstab.m_backend.data._M_elems[3] = 0;
          lowstab.m_backend.data._M_elems[4] = 0;
          lowstab.m_backend.data._M_elems[5] = 0;
          lowstab.m_backend.data._M_elems[6] = 0;
          lowstab.m_backend.data._M_elems[7] = 0;
          lowstab.m_backend.data._M_elems[8] = 0;
          lowstab.m_backend.data._M_elems[9] = 0;
          lowstab.m_backend.data._M_elems[10] = 0;
          lowstab.m_backend.data._M_elems[0xb] = 0;
          lowstab.m_backend.data._M_elems[0xc] = 0;
          lowstab.m_backend.data._M_elems[0xd] = 0;
          lowstab.m_backend.data._M_elems[0xe] = 0;
          lowstab.m_backend.data._M_elems[0xf] = 0;
          lowstab.m_backend.data._M_elems[0x10] = 0;
          lowstab.m_backend.data._M_elems[0x11] = 0;
          lowstab.m_backend.data._M_elems[0x12] = 0;
          lowstab.m_backend.data._M_elems[0x13] = 0;
          lowstab.m_backend.data._M_elems[0x14] = 0;
          lowstab.m_backend.data._M_elems[0x15] = 0;
          lowstab.m_backend.data._M_elems[0x16] = 0;
          lowstab.m_backend.data._M_elems[0x17] = 0;
          lowstab.m_backend.data._M_elems[0x18] = 0;
          lowstab.m_backend.data._M_elems[0x19] = 0;
          lowstab.m_backend.data._M_elems._104_5_ = 0;
          lowstab.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          lowstab.m_backend.exp = 0;
          lowstab.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&lowstab.m_backend,&result_1.m_backend,&x_1.m_backend);
          pcVar36 = &lowstab.m_backend;
          pcVar30 = (cpp_dec_float<200U,_int,_void> *)local_b38;
          for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
            (pcVar30->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
            pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar55 * -8 + 4);
            pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar55 * -8 + 4);
          }
          iStack_ac8 = lowstab.m_backend.exp;
          bStack_ac4 = lowstab.m_backend.neg;
          local_ac0._0_4_ = lowstab.m_backend.fpclass;
          local_ac0._4_4_ = lowstab.m_backend.prec_elem;
          pcVar36 = local_cd0;
          if (((lowstab.m_backend.fpclass != cpp_dec_float_NaN) &&
              ((fpclass_type)local_a30 != cpp_dec_float_NaN)) &&
             (iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_b38,
                                  (cpp_dec_float<200U,_int,_void> *)local_aa8), pcVar36 = local_cd0,
             iVar15 < 1)) {
            uVar13 = x_1.m_backend.neg;
            if (x_1.m_backend.neg == true) {
              uVar13 = x_1.m_backend.fpclass == cpp_dec_float_finite &&
                       x_1.m_backend.data._M_elems[0] == 0;
            }
            local_a18._0_4_ = x_1.m_backend.data._M_elems[0];
            lVar27 = 0x1b;
            puVar40 = (uint *)(local_a18 + 4);
            puVar37 = x_1.m_backend.data._M_elems + 1;
            iVar15 = x_1.m_backend.exp;
            uVar25 = x_1.m_backend._120_8_;
            goto LAB_005c5c74;
          }
        }
LAB_005c5717:
        lowstab.m_backend.fpclass = cpp_dec_float_finite;
        lowstab.m_backend.prec_elem = 0x1c;
        lowstab.m_backend.data._M_elems[0] = 0;
        lowstab.m_backend.data._M_elems[1] = 0;
        lowstab.m_backend.data._M_elems[2] = 0;
        lowstab.m_backend.data._M_elems[3] = 0;
        lowstab.m_backend.data._M_elems[4] = 0;
        lowstab.m_backend.data._M_elems[5] = 0;
        lowstab.m_backend.data._M_elems[6] = 0;
        lowstab.m_backend.data._M_elems[7] = 0;
        lowstab.m_backend.data._M_elems[8] = 0;
        lowstab.m_backend.data._M_elems[9] = 0;
        lowstab.m_backend.data._M_elems[10] = 0;
        lowstab.m_backend.data._M_elems[0xb] = 0;
        lowstab.m_backend.data._M_elems[0xc] = 0;
        lowstab.m_backend.data._M_elems[0xd] = 0;
        lowstab.m_backend.data._M_elems[0xe] = 0;
        lowstab.m_backend.data._M_elems[0xf] = 0;
        lowstab.m_backend.data._M_elems[0x10] = 0;
        lowstab.m_backend.data._M_elems[0x11] = 0;
        lowstab.m_backend.data._M_elems[0x12] = 0;
        lowstab.m_backend.data._M_elems[0x13] = 0;
        lowstab.m_backend.data._M_elems[0x14] = 0;
        lowstab.m_backend.data._M_elems[0x15] = 0;
        lowstab.m_backend.data._M_elems[0x16] = 0;
        lowstab.m_backend.data._M_elems[0x17] = 0;
        lowstab.m_backend.data._M_elems[0x18] = 0;
        lowstab.m_backend.data._M_elems[0x19] = 0;
        lowstab.m_backend.data._M_elems._104_5_ = 0;
        lowstab.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        lowstab.m_backend.exp = 0;
        lowstab.m_backend.neg = false;
        if (&lowstab.m_backend != pcVar36) {
          pcVar30 = &lowstab.m_backend;
          for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
            (pcVar30->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
            pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar55 * -8 + 4);
            pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar55 * -8 + 4);
          }
          lowstab.m_backend.exp =
               (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .delta.m_backend.exp;
          lowstab.m_backend.neg =
               (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .delta.m_backend.neg;
          lowstab.m_backend.fpclass =
               (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .delta.m_backend.fpclass;
          lowstab.m_backend.prec_elem =
               (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .delta.m_backend.prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                  (&lowstab.m_backend,(cpp_dec_float<200U,_int,_void> *)local_aa8);
        if ((((fpclass_type)local_ac0 != cpp_dec_float_NaN) &&
            (lowstab.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_b38,&lowstab.m_backend),
           0 < iVar15)) break;
      }
      else {
        if (pSVar24->theRep *
            ((pSVar24->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thedesc.costat)->data[iVar15] < 1) {
          pnVar34 = pnVar49 + iVar15;
          pnVar35 = &result_1;
          for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
            (pnVar35->m_backend).data._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
            pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar34 + ((ulong)bVar55 * -2 + 1) * 4);
            pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar35 + ((ulong)bVar55 * -2 + 1) * 4);
          }
          iVar18 = pnVar49[iVar15].m_backend.exp;
          result_1.m_backend.exp = iVar18;
          bVar54 = pnVar49[iVar15].m_backend.neg;
          result_1.m_backend.neg = bVar54;
          fVar17 = pnVar49[iVar15].m_backend.fpclass;
          iVar4 = pnVar49[iVar15].m_backend.prec_elem;
          result_1.m_backend.prec_elem = iVar4;
          result_1.m_backend.fpclass = fVar17;
          pnVar34 = &result_1;
          pcVar30 = &lowstab.m_backend;
          for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
            (pcVar30->data)._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
            pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar34 + ((ulong)bVar55 * -2 + 1) * 4);
            pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar55 * -8 + 4);
          }
          lowstab.m_backend.prec_elem = iVar4;
          lowstab.m_backend.fpclass = fVar17;
          lowstab.m_backend.neg = bVar54;
          if ((bVar54 == true) &&
             (lowstab.m_backend.data._M_elems[0] != 0 || fVar17 != cpp_dec_float_finite)) {
            lowstab.m_backend.neg = false;
          }
          if (((fVar17 != cpp_dec_float_NaN) &&
              (bVar54 = (fpclass_type)local_9a0 != cpp_dec_float_NaN, bVar54)) &&
             (lowstab.m_backend.exp = iVar18,
             iVar18 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (&lowstab.m_backend,(cpp_dec_float<200U,_int,_void> *)local_a18),
             pcVar36 = local_cd0, 0 < iVar18)) {
            pnVar34 = low;
            if (result_1.m_backend.fpclass != cpp_dec_float_NaN) {
              lowstab.m_backend.fpclass = cpp_dec_float_finite;
              lowstab.m_backend.prec_elem = 0x1c;
              lowstab.m_backend.data._M_elems[0] = 0;
              lowstab.m_backend.data._M_elems[1] = 0;
              lowstab.m_backend.data._M_elems[2] = 0;
              lowstab.m_backend.data._M_elems[3] = 0;
              lowstab.m_backend.data._M_elems[4] = 0;
              lowstab.m_backend.data._M_elems[5] = 0;
              lowstab.m_backend.data._M_elems[6] = 0;
              lowstab.m_backend.data._M_elems[7] = 0;
              lowstab.m_backend.data._M_elems[8] = 0;
              lowstab.m_backend.data._M_elems[9] = 0;
              lowstab.m_backend.data._M_elems[10] = 0;
              lowstab.m_backend.data._M_elems[0xb] = 0;
              lowstab.m_backend.data._M_elems[0xc] = 0;
              lowstab.m_backend.data._M_elems[0xd] = 0;
              lowstab.m_backend.data._M_elems[0xe] = 0;
              lowstab.m_backend.data._M_elems[0xf] = 0;
              lowstab.m_backend.data._M_elems[0x10] = 0;
              lowstab.m_backend.data._M_elems[0x11] = 0;
              lowstab.m_backend.data._M_elems[0x12] = 0;
              lowstab.m_backend.data._M_elems[0x13] = 0;
              lowstab.m_backend.data._M_elems[0x14] = 0;
              lowstab.m_backend.data._M_elems[0x15] = 0;
              lowstab.m_backend.data._M_elems[0x16] = 0;
              lowstab.m_backend.data._M_elems[0x17] = 0;
              lowstab.m_backend.data._M_elems[0x18] = 0;
              lowstab.m_backend.data._M_elems[0x19] = 0;
              lowstab.m_backend.data._M_elems._104_5_ = 0;
              lowstab.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              lowstab.m_backend.exp = 0;
              lowstab.m_backend.neg = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&lowstab.m_backend,0.0);
              iVar18 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&result_1.m_backend,&lowstab.m_backend);
              if (0 < iVar18) {
                pnVar34 = upp;
              }
            }
            pnVar35 = pnVar34 + iVar15;
            pcVar36 = (cpp_dec_float<200U,_int,_void> *)local_b38;
            for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pcVar36->data)._M_elems[0] = (pnVar35->m_backend).data._M_elems[0];
              pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar35 + ((ulong)bVar55 * -2 + 1) * 4);
              pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar55 * -8 + 4);
            }
            iStack_ac8 = pnVar34[iVar15].m_backend.exp;
            bStack_ac4 = pnVar34[iVar15].m_backend.neg;
            local_ac0._0_4_ = pnVar34[iVar15].m_backend.fpclass;
            local_ac0._4_4_ = pnVar34[iVar15].m_backend.prec_elem;
            x_1.m_backend.fpclass = cpp_dec_float_finite;
            x_1.m_backend.prec_elem = 0x1c;
            x_1.m_backend.data._M_elems[0] = 0;
            x_1.m_backend.data._M_elems[1] = 0;
            x_1.m_backend.data._M_elems[2] = 0;
            x_1.m_backend.data._M_elems[3] = 0;
            x_1.m_backend.data._M_elems[4] = 0;
            x_1.m_backend.data._M_elems[5] = 0;
            x_1.m_backend.data._M_elems[6] = 0;
            x_1.m_backend.data._M_elems[7] = 0;
            x_1.m_backend.data._M_elems[8] = 0;
            x_1.m_backend.data._M_elems[9] = 0;
            x_1.m_backend.data._M_elems[10] = 0;
            x_1.m_backend.data._M_elems[0xb] = 0;
            x_1.m_backend.data._M_elems[0xc] = 0;
            x_1.m_backend.data._M_elems[0xd] = 0;
            x_1.m_backend.data._M_elems[0xe] = 0;
            x_1.m_backend.data._M_elems[0xf] = 0;
            x_1.m_backend.data._M_elems[0x10] = 0;
            x_1.m_backend.data._M_elems[0x11] = 0;
            x_1.m_backend.data._M_elems[0x12] = 0;
            x_1.m_backend.data._M_elems[0x13] = 0;
            x_1.m_backend.data._M_elems[0x14] = 0;
            x_1.m_backend.data._M_elems[0x15] = 0;
            x_1.m_backend.data._M_elems[0x16] = 0;
            x_1.m_backend.data._M_elems[0x17] = 0;
            x_1.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
            x_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            x_1.m_backend.exp = 0;
            x_1.m_backend.neg = false;
            if (&x_1.m_backend == &pnVar39[iVar15].m_backend) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&x_1.m_backend,(cpp_dec_float<200U,_int,_void> *)local_b38);
              if (x_1.m_backend.data._M_elems[0] != 0 ||
                  x_1.m_backend.fpclass != cpp_dec_float_finite) {
                x_1.m_backend.neg = (bool)(x_1.m_backend.neg ^ 1);
              }
            }
            else {
              pcVar36 = (cpp_dec_float<200U,_int,_void> *)local_b38;
              pcVar30 = &x_1.m_backend;
              for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
                (pcVar30->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
                pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar55 * -8 + 4)
                ;
                pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar55 * -8 + 4)
                ;
              }
              x_1.m_backend.prec_elem = local_ac0._4_4_;
              x_1.m_backend.fpclass = (fpclass_type)local_ac0;
              x_1.m_backend.exp = iStack_ac8;
              x_1.m_backend.neg = bStack_ac4;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&x_1.m_backend,&pnVar39[iVar15].m_backend);
            }
            lowstab.m_backend.fpclass = cpp_dec_float_finite;
            lowstab.m_backend.prec_elem = 0x1c;
            lowstab.m_backend.data._M_elems[0] = 0;
            lowstab.m_backend.data._M_elems[1] = 0;
            lowstab.m_backend.data._M_elems[2] = 0;
            lowstab.m_backend.data._M_elems[3] = 0;
            lowstab.m_backend.data._M_elems[4] = 0;
            lowstab.m_backend.data._M_elems[5] = 0;
            lowstab.m_backend.data._M_elems[6] = 0;
            lowstab.m_backend.data._M_elems[7] = 0;
            lowstab.m_backend.data._M_elems[8] = 0;
            lowstab.m_backend.data._M_elems[9] = 0;
            lowstab.m_backend.data._M_elems[10] = 0;
            lowstab.m_backend.data._M_elems[0xb] = 0;
            lowstab.m_backend.data._M_elems[0xc] = 0;
            lowstab.m_backend.data._M_elems[0xd] = 0;
            lowstab.m_backend.data._M_elems[0xe] = 0;
            lowstab.m_backend.data._M_elems[0xf] = 0;
            lowstab.m_backend.data._M_elems[0x10] = 0;
            lowstab.m_backend.data._M_elems[0x11] = 0;
            lowstab.m_backend.data._M_elems[0x12] = 0;
            lowstab.m_backend.data._M_elems[0x13] = 0;
            lowstab.m_backend.data._M_elems[0x14] = 0;
            lowstab.m_backend.data._M_elems[0x15] = 0;
            lowstab.m_backend.data._M_elems[0x16] = 0;
            lowstab.m_backend.data._M_elems[0x17] = 0;
            lowstab.m_backend.data._M_elems[0x18] = 0;
            lowstab.m_backend.data._M_elems[0x19] = 0;
            lowstab.m_backend.data._M_elems._104_5_ = 0;
            lowstab.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            lowstab.m_backend.exp = 0;
            lowstab.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&lowstab.m_backend,&x_1.m_backend,&result_1.m_backend);
            pcVar36 = &lowstab.m_backend;
            pcVar30 = (cpp_dec_float<200U,_int,_void> *)local_b38;
            for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pcVar30->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
              pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar55 * -8 + 4);
              pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar55 * -8 + 4);
            }
            iStack_ac8 = lowstab.m_backend.exp;
            bStack_ac4 = lowstab.m_backend.neg;
            local_ac0._0_4_ = lowstab.m_backend.fpclass;
            local_ac0._4_4_ = lowstab.m_backend.prec_elem;
            pcVar36 = local_cd0;
            if (((lowstab.m_backend.fpclass != cpp_dec_float_NaN) &&
                ((fpclass_type)local_a30 != cpp_dec_float_NaN)) &&
               (iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   ((cpp_dec_float<200U,_int,_void> *)local_b38,
                                    (cpp_dec_float<200U,_int,_void> *)local_aa8),
               pcVar36 = local_cd0, iVar15 < 1)) {
              uVar13 = result_1.m_backend.neg;
              if (result_1.m_backend.neg == true) {
                uVar13 = result_1.m_backend.fpclass == cpp_dec_float_finite &&
                         result_1.m_backend.data._M_elems[0] == 0;
              }
              local_a18._0_4_ = result_1.m_backend.data._M_elems[0];
              lVar27 = 0x1b;
              puVar37 = result_1.m_backend.data._M_elems + 1;
              puVar40 = (uint *)(local_a18 + 4);
              iVar15 = result_1.m_backend.exp;
              uVar25 = result_1.m_backend._120_8_;
LAB_005c5c74:
              for (; local_cc4 = (uint)uVar51, iStack_9a8 = iVar15, bStack_9a4 = (bool)uVar13,
                  local_9a0 = uVar25, lVar27 != 0; lVar27 = lVar27 + -1) {
                *puVar40 = *puVar37;
                puVar37 = puVar37 + (ulong)bVar55 * -2 + 1;
                puVar40 = puVar40 + (ulong)bVar55 * -2 + 1;
              }
            }
          }
          goto LAB_005c5717;
        }
        pBVar6[uVar51].idx = -1;
        pUVar44 = pSVar24->theCoPvec;
LAB_005c5222:
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::clearIdx(&pUVar44->thedelta,iVar15);
      }
      uVar56 = uVar51 & 0xffffffff;
      uVar51 = uVar51 + 1;
    } while ((long)uVar51 < (long)nBp);
  }
  pnVar34 = &(this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).fastDelta;
  lowstab.m_backend.fpclass = cpp_dec_float_finite;
  lowstab.m_backend.prec_elem = 0x1c;
  lowstab.m_backend.data._M_elems[0] = 0;
  lowstab.m_backend.data._M_elems[1] = 0;
  lowstab.m_backend.data._M_elems[2] = 0;
  lowstab.m_backend.data._M_elems[3] = 0;
  lowstab.m_backend.data._M_elems[4] = 0;
  lowstab.m_backend.data._M_elems[5] = 0;
  lowstab.m_backend.data._M_elems[6] = 0;
  lowstab.m_backend.data._M_elems[7] = 0;
  lowstab.m_backend.data._M_elems[8] = 0;
  lowstab.m_backend.data._M_elems[9] = 0;
  lowstab.m_backend.data._M_elems[10] = 0;
  lowstab.m_backend.data._M_elems[0xb] = 0;
  lowstab.m_backend.data._M_elems[0xc] = 0;
  lowstab.m_backend.data._M_elems[0xd] = 0;
  lowstab.m_backend.data._M_elems[0xe] = 0;
  lowstab.m_backend.data._M_elems[0xf] = 0;
  lowstab.m_backend.data._M_elems[0x10] = 0;
  lowstab.m_backend.data._M_elems[0x11] = 0;
  lowstab.m_backend.data._M_elems[0x12] = 0;
  lowstab.m_backend.data._M_elems[0x13] = 0;
  lowstab.m_backend.data._M_elems[0x14] = 0;
  lowstab.m_backend.data._M_elems[0x15] = 0;
  lowstab.m_backend.data._M_elems[0x16] = 0;
  lowstab.m_backend.data._M_elems[0x17] = 0;
  lowstab.m_backend.data._M_elems[0x18] = 0;
  lowstab.m_backend.data._M_elems[0x19] = 0;
  lowstab.m_backend.data._M_elems._104_5_ = 0;
  lowstab.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  lowstab.m_backend.exp = 0;
  lowstab.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&lowstab.m_backend,&pnVar34->m_backend,(cpp_dec_float<200U,_int,_void> *)local_a18);
  bVar54 = lowstab.m_backend.neg;
  pcVar36 = &lowstab.m_backend;
  puVar40 = (uint *)local_798;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    *puVar40 = (pcVar36->data)._M_elems[0];
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar55 * -8 + 4);
    puVar40 = puVar40 + (ulong)bVar55 * -2 + 1;
  }
  local_cc0 = lowstab.m_backend.exp;
  local_cd0 = (cpp_dec_float<200U,_int,_void> *)CONCAT44(local_cd0._4_4_,lowstab.m_backend.fpclass);
  local_cb8._0_4_ = lowstab.m_backend.prec_elem;
  bVar14 = ((this->
            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .thesolver)->instableLeave;
  peVar11 = (this->
            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->
            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  dVar3 = peVar11->s_epsilon_multiplier;
  uVar56 = -(ulong)(dVar3 == 1.0);
  lowstab.m_backend.fpclass = cpp_dec_float_finite;
  lowstab.m_backend.prec_elem = 0x1c;
  lowstab.m_backend.data._M_elems._0_16_ = ZEXT816(0);
  lowstab.m_backend.data._M_elems._16_16_ = ZEXT816(0);
  lowstab.m_backend.data._M_elems._32_16_ = ZEXT816(0);
  lowstab.m_backend.data._M_elems._48_16_ = ZEXT816(0);
  lowstab.m_backend.data._M_elems._64_16_ = ZEXT816(0);
  lowstab.m_backend.data._M_elems._80_16_ = ZEXT816(0);
  lowstab.m_backend.data._M_elems[0x18] = 0;
  lowstab.m_backend.data._M_elems[0x19] = 0;
  lowstab.m_backend.data._M_elems._104_5_ = 0;
  lowstab.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  lowstab.m_backend.exp = 0;
  lowstab.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&lowstab,
             (double)(~uVar56 & (ulong)(dVar3 * 1e-10) | uVar56 & 0x3ddb7cdfd9d7bdbb));
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  local_a20 = &pnVar34->m_backend;
  if (bVar14 == false) {
    puVar40 = (uint *)local_a18;
    pnVar34 = &local_b0;
    for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
      (pnVar34->m_backend).data._M_elems[0] = *puVar40;
      puVar40 = puVar40 + (ulong)bVar55 * -2 + 1;
      pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar34 + ((ulong)bVar55 * -2 + 1) * 4);
    }
    local_b0.m_backend.exp = iStack_9a8;
    local_b0.m_backend.neg = bStack_9a4;
    local_b0.m_backend.fpclass = (fpclass_type)local_9a0;
    local_b0.m_backend.prec_elem = local_9a0._4_4_;
    SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::minStability(&result_1,
                   &this->
                    super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ,&local_b0);
    pnVar34 = &result_1;
    iVar16 = result_1.m_backend.exp;
    uVar13 = result_1.m_backend.neg;
    fVar17 = result_1.m_backend.fpclass;
  }
  else {
    pnVar34 = &lowstab;
    pnVar35 = &lowstab;
    pnVar47 = &result_1;
    for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
      (pnVar47->m_backend).data._M_elems[0] = (pnVar35->m_backend).data._M_elems[0];
      pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar35 + ((ulong)bVar55 * -2 + 1) * 4);
      pnVar47 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar47 + ((ulong)bVar55 * -2 + 1) * 4);
    }
    iVar16 = lowstab.m_backend.exp;
    uVar13 = lowstab.m_backend.neg;
    fVar17 = lowstab.m_backend.fpclass;
  }
  uVar52 = local_cc4;
  iVar4 = (pnVar34->m_backend).prec_elem;
  pnVar34 = &result_1;
  pnVar35 = &stab;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    (pnVar35->m_backend).data._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
    pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar34 + ((ulong)bVar55 * -2 + 1) * 4);
    pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar35 + ((ulong)bVar55 * -2 + 1) * 4);
  }
  stab.m_backend.exp = iVar16;
  stab.m_backend.neg = (bool)uVar13;
  stab.m_backend.prec_elem = iVar4;
  stab.m_backend.fpclass = fVar17;
  if ((int)local_cc4 < 0) {
    uVar52 = local_cc8;
    uVar1 = local_cc8;
    if (-1 < (int)local_cc8) {
      do {
        while( true ) {
          local_cc8 = uVar1;
          uVar26 = uVar52;
          pBVar6 = (this->breakpoints).data.
                   super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar15 = pBVar6[uVar26].idx;
          if (iVar15 < 0) break;
          if (pBVar6[uVar26].src == PVEC) {
            pnVar34 = &local_530;
            pnVar35 = &stab;
            pnVar47 = pnVar34;
            for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pnVar47->m_backend).data._M_elems[0] = (pnVar35->m_backend).data._M_elems[0];
              pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar35 + ((ulong)bVar55 * -2 + 1) * 4);
              pnVar47 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar47 + ((ulong)bVar55 * -2 + 1) * 4);
            }
            local_530.m_backend.exp = iVar16;
            local_530.m_backend.neg = (bool)uVar13;
            local_530.m_backend.fpclass = fVar17;
            local_530.m_backend.prec_elem = iVar4;
            pnVar35 = &local_5b0;
            puVar40 = (uint *)local_798;
            pnVar47 = pnVar35;
            for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pnVar47->m_backend).data._M_elems[0] = *puVar40;
              puVar40 = puVar40 + (ulong)bVar55 * -2 + 1;
              pnVar47 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar47 + ((ulong)bVar55 * -2 + 1) * 4);
            }
            local_5b0.m_backend.exp = local_cc0;
            local_5b0.m_backend.neg = bVar54;
            local_5b0.m_backend.fpclass = (fpclass_type)local_cd0;
            local_5b0.m_backend.prec_elem = (fpclass_type)local_cb8;
            pnVar47 = &local_430;
            pcVar36 = &local_818;
            pnVar48 = pnVar47;
            for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pnVar48->m_backend).data._M_elems[0] = (pcVar36->data)._M_elems[0];
              pcVar36 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar36 + ((ulong)bVar55 * -2 + 1) * 4);
              pnVar48 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar48 + ((ulong)bVar55 * -2 + 1) * 4);
            }
            local_430.m_backend.exp = local_818.exp;
            local_430.m_backend.neg = local_818.neg;
            local_430.m_backend.fpclass = local_818.fpclass;
            local_430.m_backend.prec_elem = local_818.prec_elem;
            BVar57 = PVEC;
            pnVar48 = pnVar46;
            vec = pnVar38;
            low_00 = low_01;
            upp_00 = upp_01;
          }
          else {
            pnVar34 = &local_630;
            pnVar35 = &stab;
            pnVar47 = pnVar34;
            for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pnVar47->m_backend).data._M_elems[0] = (pnVar35->m_backend).data._M_elems[0];
              pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar35 + ((ulong)bVar55 * -2 + 1) * 4);
              pnVar47 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar47 + ((ulong)bVar55 * -2 + 1) * 4);
            }
            local_630.m_backend.exp = iVar16;
            local_630.m_backend.neg = (bool)uVar13;
            local_630.m_backend.fpclass = fVar17;
            local_630.m_backend.prec_elem = iVar4;
            pnVar35 = &local_6b0;
            puVar40 = (uint *)local_798;
            pnVar47 = pnVar35;
            for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pnVar47->m_backend).data._M_elems[0] = *puVar40;
              puVar40 = puVar40 + (ulong)bVar55 * -2 + 1;
              pnVar47 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar47 + ((ulong)bVar55 * -2 + 1) * 4);
            }
            local_6b0.m_backend.exp = local_cc0;
            local_6b0.m_backend.neg = bVar54;
            local_6b0.m_backend.fpclass = (fpclass_type)local_cd0;
            local_6b0.m_backend.prec_elem = (fpclass_type)local_cb8;
            pnVar47 = &local_4b0;
            pcVar36 = &local_818;
            pnVar48 = pnVar47;
            for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pnVar48->m_backend).data._M_elems[0] = (pcVar36->data)._M_elems[0];
              pcVar36 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar36 + ((ulong)bVar55 * -2 + 1) * 4);
              pnVar48 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar48 + ((ulong)bVar55 * -2 + 1) * 4);
            }
            local_4b0.m_backend.exp = local_818.exp;
            local_4b0.m_backend.neg = local_818.neg;
            local_4b0.m_backend.fpclass = local_818.fpclass;
            local_4b0.m_backend.prec_elem = local_818.prec_elem;
            BVar57 = COPVEC;
            pnVar48 = pnVar49;
            vec = pnVar39;
            low_00 = low;
            upp_00 = upp;
          }
          bVar14 = getData(this,local_ca0,&enterId,iVar15,pnVar34,pnVar35,pnVar48,vec,low_00,upp_00,
                           BVar57,pnVar47);
          local_cc8 = uVar26;
          if ((bVar14) || (uVar52 = uVar26 - 1, uVar1 = uVar26 - 1, (int)uVar26 < 1))
          goto LAB_005c6323;
        }
        uVar52 = uVar26 - 1;
        uVar1 = local_cc8;
      } while (uVar26 != 0);
    }
LAB_005c643d:
    if (this->relax_count < 2) {
      SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::relax(&this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             );
      this->relax_count = this->relax_count + 1;
      pcVar36 = &local_818;
      pnVar38 = local_ca0;
      for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
        (pnVar38->m_backend).data._M_elems[0] = (pcVar36->data)._M_elems[0];
        pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar55 * -2 + 1) * 4);
        pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar38 + ((ulong)bVar55 * -2 + 1) * 4);
      }
      (local_ca0->m_backend).exp = local_818.exp;
      (local_ca0->m_backend).neg = local_818.neg;
      (local_ca0->m_backend).fpclass = local_818.fpclass;
      (local_ca0->m_backend).prec_elem = local_818.prec_elem;
      enterId = selectEnter(this,local_ca0,local_cbc,false);
    }
    return (SPxId)enterId.super_DataKey;
  }
  if ((fVar17 == cpp_dec_float_NaN || (fpclass_type)local_9a0 == cpp_dec_float_NaN) ||
     (iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         ((cpp_dec_float<200U,_int,_void> *)local_a18,&stab.m_backend), iVar16 < 1))
  goto LAB_005c643d;
  pBVar6 = (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar16 = pBVar6[uVar52].idx;
  if (pBVar6[uVar52].src == PVEC) {
    pnVar34 = &local_130;
    pnVar39 = &stab;
    pnVar49 = pnVar34;
    for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
      (pnVar49->m_backend).data._M_elems[0] = (pnVar39->m_backend).data._M_elems[0];
      pnVar39 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar39 + ((ulong)bVar55 * -2 + 1) * 4);
      pnVar49 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar49 + ((ulong)bVar55 * -2 + 1) * 4);
    }
    local_130.m_backend.exp = stab.m_backend.exp;
    local_130.m_backend.neg = stab.m_backend.neg;
    local_130.m_backend.fpclass = stab.m_backend.fpclass;
    local_130.m_backend.prec_elem = stab.m_backend.prec_elem;
    pnVar35 = &local_1b0;
    puVar40 = (uint *)local_798;
    pnVar39 = pnVar35;
    for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
      (pnVar39->m_backend).data._M_elems[0] = *puVar40;
      puVar40 = puVar40 + (ulong)bVar55 * -2 + 1;
      pnVar39 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar39 + ((ulong)bVar55 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = local_cc0;
    local_1b0.m_backend.neg = bVar54;
    local_1b0.m_backend.fpclass = (fpclass_type)local_cd0;
    local_1b0.m_backend.prec_elem = (fpclass_type)local_cb8;
    pnVar47 = &local_230;
    pcVar36 = &local_818;
    pnVar39 = pnVar47;
    for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
      (pnVar39->m_backend).data._M_elems[0] = (pcVar36->data)._M_elems[0];
      pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar55 * -2 + 1) * 4);
      pnVar39 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar39 + ((ulong)bVar55 * -2 + 1) * 4);
    }
    local_230.m_backend.exp = local_818.exp;
    local_230.m_backend.neg = local_818.neg;
    local_230.m_backend.fpclass = local_818.fpclass;
    local_230.m_backend.prec_elem = local_818.prec_elem;
    BVar57 = PVEC;
  }
  else {
    pnVar34 = &local_2b0;
    pnVar38 = &stab;
    pnVar46 = pnVar34;
    for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
      (pnVar46->m_backend).data._M_elems[0] = (pnVar38->m_backend).data._M_elems[0];
      pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar38 + ((ulong)bVar55 * -2 + 1) * 4);
      pnVar46 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar46 + ((ulong)bVar55 * -2 + 1) * 4);
    }
    local_2b0.m_backend.exp = stab.m_backend.exp;
    local_2b0.m_backend.neg = stab.m_backend.neg;
    local_2b0.m_backend.fpclass = stab.m_backend.fpclass;
    local_2b0.m_backend.prec_elem = stab.m_backend.prec_elem;
    pnVar35 = &local_330;
    puVar40 = (uint *)local_798;
    pnVar38 = pnVar35;
    for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
      (pnVar38->m_backend).data._M_elems[0] = *puVar40;
      puVar40 = puVar40 + (ulong)bVar55 * -2 + 1;
      pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar38 + ((ulong)bVar55 * -2 + 1) * 4);
    }
    local_330.m_backend.exp = local_cc0;
    local_330.m_backend.neg = bVar54;
    local_330.m_backend.fpclass = (fpclass_type)local_cd0;
    local_330.m_backend.prec_elem = (fpclass_type)local_cb8;
    pnVar47 = &local_3b0;
    pcVar36 = &local_818;
    pnVar38 = pnVar47;
    for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
      (pnVar38->m_backend).data._M_elems[0] = (pcVar36->data)._M_elems[0];
      pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar55 * -2 + 1) * 4);
      pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar38 + ((ulong)bVar55 * -2 + 1) * 4);
    }
    local_3b0.m_backend.exp = local_818.exp;
    local_3b0.m_backend.neg = local_818.neg;
    local_3b0.m_backend.fpclass = local_818.fpclass;
    local_3b0.m_backend.prec_elem = local_818.prec_elem;
    BVar57 = COPVEC;
    pnVar46 = pnVar49;
    pnVar38 = pnVar39;
    low_01 = low;
    upp_01 = upp;
  }
  bVar14 = getData(this,local_ca0,&enterId,iVar16,pnVar34,pnVar35,pnVar46,pnVar38,low_01,upp_01,
                   BVar57,pnVar47);
LAB_005c6323:
  if (bVar14 == false) goto LAB_005c643d;
  this->relax_count = 0;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tighten(&this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           );
  lVar27 = (long)(int)local_cc8;
  if (0 < lVar27) {
    pBVar6 = (this->breakpoints).data.
             super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar16 = *(int *)((long)&pBVar6[lVar27].val.m_backend + 0x70);
    bVar54 = *(bool *)((long)&pBVar6[lVar27].val.m_backend + 0x74);
    uVar25 = *(undefined8 *)((long)&pBVar6[lVar27].val.m_backend + 0x78);
    uStack_cb0 = 0;
    local_cb8 = uVar25;
    memmove(&result_1,pBVar6 + lVar27,0x70);
    result_1.m_backend.neg = bVar54;
    if ((bVar54 == true) &&
       (result_1.m_backend.data._M_elems[0] != 0 || (fpclass_type)local_cb8 != cpp_dec_float_finite)
       ) {
      result_1.m_backend.neg = false;
    }
    result_1.m_backend.exp = iVar16;
    result_1.m_backend._120_8_ = uVar25;
    if (((fpclass_type)local_cb8 != cpp_dec_float_NaN) &&
       ((this->
        super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).fastDelta.m_backend.fpclass != cpp_dec_float_NaN)) {
      iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         (&result_1.m_backend,local_a20);
      if (0 < iVar16) {
        flipAndUpdate(this,(int *)&local_cc8);
        ((this->
         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .thesolver)->boundflips = local_cc8;
        if (9 < (int)local_cc8) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                    ((cpp_dec_float<200U,_int,_void> *)this_00,1);
          uVar21._0_4_ = enterId.super_DataKey.info;
          uVar21._4_4_ = enterId.super_DataKey.idx;
          return (SPxId)uVar21;
        }
        uVar25 = 0x3fa999999999999a;
        goto LAB_005c64bc;
      }
    }
  }
  ((this->
   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   ).
   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .thesolver)->boundflips = 0;
  uVar25 = 0x3fb999999999999a;
LAB_005c64bc:
  result_1.m_backend.data._M_elems[0] = (int)uVar25;
  result_1.m_backend.data._M_elems[1] = (int)((ulong)uVar25 >> 0x20);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
  ::operator-=((number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                *)this_00,(double *)&result_1);
  uVar20._0_4_ = enterId.super_DataKey.info;
  uVar20._4_4_ = enterId.super_DataKey.idx;
  return (SPxId)uVar20;
}

Assistant:

SPxId SPxBoundFlippingRT<R>::selectEnter(
   R&                 val,
   int                   leaveIdx,
   bool                  polish
)
{
   assert(this->m_type == SPxSolverBase<R>::LEAVE);
   assert(this->thesolver->boundflips == 0);

   // reset the history and try again to do some long steps
   if(this->thesolver->leaveCount % SOPLEX_LONGSTEP_FREQ == 0)
   {
      SPxOut::debug(this, "DLBFRT06 resetting long step history\n");
      flipPotential = 1;
   }

   if(!enableBoundFlips || polish || this->thesolver->rep() == SPxSolverBase<R>::ROW
         || flipPotential <= 0)
   {
      SPxOut::debug(this, "DLBFRT07 switching to fast ratio test\n");
      return SPxFastRT<R>::selectEnter(val, leaveIdx, polish);
   }

   const R*  pvec = this->thesolver->pVec().get_const_ptr();
   const R*  pupd = this->thesolver->pVec().delta().values();
   const int*   pidx = this->thesolver->pVec().delta().indexMem();
   int          pupdnnz = this->thesolver->pVec().delta().size();
   const R*  lpb  = this->thesolver->lpBound().get_const_ptr();
   const R*  upb  = this->thesolver->upBound().get_const_ptr();

   const R*  cvec = this->thesolver->coPvec().get_const_ptr();
   const R*  cupd = this->thesolver->coPvec().delta().values();
   const int*   cidx = this->thesolver->coPvec().delta().indexMem();
   int          cupdnnz = this->thesolver->coPvec().delta().size();
   const R*  lcb  = this->thesolver->lcBound().get_const_ptr();
   const R*  ucb  = this->thesolver->ucBound().get_const_ptr();

   R max;

   // index in breakpoint array of minimal value (i.e. choice of normal RT)
   int minIdx;

   // temporary breakpoint data structure to make swaps possible
   Breakpoint tmp;

   // most stable pivot value in candidate set
   R moststable;

   // initialize invalid enterId
   SPxId enterId;

   // slope of objective function improvement
   R slope;

   // number of found breakpoints
   int nBp;

   // number of passed breakpoints
   int npassedBp;

   R degeneps;
   R stab;
   bool instable;

   max = val;
   val = 0.0;
   moststable = 0.0;
   nBp = 0;
   minIdx = -1;

   // get breakpoints and and determine the index of the minimal value
   if(max > 0)
   {
      collectBreakpointsMax(nBp, minIdx, pidx, pupdnnz, pupd, pvec, upb, lpb, PVEC);
      // coverity[negative_returns]
      collectBreakpointsMax(nBp, minIdx, cidx, cupdnnz, cupd, cvec, ucb, lcb, COPVEC);
   }
   else
   {
      collectBreakpointsMin(nBp, minIdx, pidx, pupdnnz, pupd, pvec, upb, lpb, PVEC);
      // coverity[negative_returns]
      collectBreakpointsMin(nBp, minIdx, cidx, cupdnnz, cupd, cvec, ucb, lcb, COPVEC);
   }

   if(nBp == 0)
   {
      val = max;
      return enterId;
   }

   assert(minIdx >= 0);

   // swap smallest breakpoint to the front to skip the sorting phase if no bound flip is possible
   tmp = breakpoints[minIdx];
   breakpoints[minIdx] = breakpoints[0];
   breakpoints[0] = tmp;

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < breakpoints.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(breakpoints[i].val));
         // the breakpoint formulas should not produce inf values
         assert(!isinf(breakpoints[i].val));
      }
   }

#endif

   // get initial slope
   slope = spxAbs(this->thesolver->fTest()[leaveIdx]);

   if(slope == 0)
   {
      // this may only happen if SoPlex decides to make an instable pivot
      assert(this->thesolver->instableLeaveNum >= 0);
      // restore original slope
      slope = spxAbs(this->thesolver->instableLeaveVal);
   }

   // set up structures for the quicksort implementation
   BreakpointCompare compare;
   compare.entry = breakpoints.get_const_ptr();

   // pointer to end of sorted part of breakpoints
   int sorted = 0;
   // minimum number of entries that are supposed to be sorted by partial sort
   int sortsize = 4;

   // get all skipable breakpoints
   for(npassedBp = 0; npassedBp < nBp && slope > 0; ++npassedBp)
   {
      // sort breakpoints only partially to save time
      if(npassedBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      int i = breakpoints[npassedBp].idx;

      // compute new slope
      if(breakpoints[npassedBp].src == PVEC)
      {
         if(this->thesolver->isBasic(i))
         {
            // mark basic indices
            breakpoints[npassedBp].idx = -1;
            this->thesolver->pVec().delta().clearIdx(i);
         }
         else
         {
            R absupd = spxAbs(pupd[i]);
            slope -= (this->thesolver->upper(i) * absupd) - (this->thesolver->lower(i) * absupd);

            // get most stable pivot
            if(absupd > moststable)
               moststable = absupd;
         }
      }
      else
      {
         assert(breakpoints[npassedBp].src == COPVEC);

         if(this->thesolver->isCoBasic(i))
         {
            // mark basic indices
            breakpoints[npassedBp].idx = -1;
            this->thesolver->coPvec().delta().clearIdx(i);
         }
         else
         {
            R absupd = spxAbs(cupd[i]);
            slope -= (this->thesolver->rhs(i) * absupd) - (this->thesolver->lhs(i) * absupd);

            if(absupd > moststable)
               moststable = absupd;
         }
      }
   }

   --npassedBp;
   assert(npassedBp >= 0);

   // check for unboundedness/infeasibility
   if(slope > this->delta && npassedBp >= nBp - 1)
   {
      SPxOut::debug(this, "DLBFRT02 {}: unboundedness in ratio test\n",
                    this->thesolver->basis().iteration());
      flipPotential -= 0.5;
      val = max;
      return SPxFastRT<R>::selectEnter(val, leaveIdx);
   }

   SPxOut::debug(this, "DLBFRT01 {}: number of flip candidates: {}\n",
                 this->thesolver->basis().iteration(), npassedBp);

   // try to get a more stable pivot by looking at those with similar step length
   int stableBp;              // index to walk over additional breakpoints (after slope change)
   int bestBp = -1;           // breakpoints index with best possible stability
   R bestDelta = breakpoints[npassedBp].val;  // best step length (after bound flips)

   for(stableBp = npassedBp + 1; stableBp < nBp; ++stableBp)
   {
      R stableDelta = 0;

      // get next breakpoints in increasing order
      if(stableBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      int idx = breakpoints[stableBp].idx;

      if(breakpoints[stableBp].src == PVEC)
      {
         if(this->thesolver->isBasic(idx))
         {
            // mark basic indices
            breakpoints[stableBp].idx = -1;
            this->thesolver->pVec().delta().clearIdx(idx);
            continue;
         }

         R x = pupd[idx];

         if(spxAbs(x) > moststable)
         {
            this->thesolver->pVec()[idx] = this->thesolver->vector(idx) * this->thesolver->coPvec();
            stableDelta = (x > 0.0) ? upb[idx] : lpb[idx];
            stableDelta = (stableDelta - pvec[idx]) / x;

            if(stableDelta <= bestDelta)
            {
               moststable = spxAbs(x);
               bestBp = stableBp;
            }
         }
      }
      else
      {
         if(this->thesolver->isCoBasic(idx))
         {
            // mark basic indices
            breakpoints[stableBp].idx = -1;
            this->thesolver->coPvec().delta().clearIdx(idx);
            continue;
         }

         R x = cupd[idx];

         if(spxAbs(x) > moststable)
         {
            stableDelta = (x > 0.0) ? ucb[idx] : lcb[idx];
            stableDelta = (stableDelta - cvec[idx]) / x;

            if(stableDelta <= bestDelta)
            {
               moststable = spxAbs(x);
               bestBp = stableBp;
            }
         }
      }

      // stop searching if the step length is too big
      if(stableDelta > this->delta + bestDelta)
         break;
   }

   degeneps = this->fastDelta / moststable;  /* as in SPxFastRT */
   // get stability requirements
   instable = this->thesolver->instableLeave;
   assert(!instable || this->thesolver->instableLeaveNum >= 0);
   R lowstab = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_LOWSTAB);
   stab = instable ? lowstab : SPxFastRT<R>::minStability(moststable);

   bool foundStable = false;

   if(bestBp >= 0)
   {
      // found a more stable pivot
      if(moststable > stab)
      {
         // stability requirements are satisfied
         int idx = breakpoints[bestBp].idx;
         assert(idx >= 0);

         if(breakpoints[bestBp].src == PVEC)
            foundStable = getData(val, enterId, idx, stab, degeneps, pupd, pvec, lpb, upb, PVEC, max);
         else
            foundStable = getData(val, enterId, idx, stab, degeneps, cupd, cvec, lcb, ucb, COPVEC, max);
      }
   }

   else
   {
      // scan passed breakpoints from back to front and stop as soon as a good one is found
      while(!foundStable && npassedBp >= 0)
      {
         int idx = breakpoints[npassedBp].idx;

         // only look for non-basic variables
         if(idx >= 0)
         {
            if(breakpoints[npassedBp].src == PVEC)
               foundStable = getData(val, enterId, idx, stab, degeneps, pupd, pvec, lpb, upb, PVEC, max);
            else
               foundStable = getData(val, enterId, idx, stab, degeneps, cupd, cvec, lcb, ucb, COPVEC, max);
         }

         --npassedBp;
      }

      ++npassedBp;
   }

   if(!foundStable)
   {
      assert(!enterId.isValid());

      if(relax_count < SOPLEX_MAX_RELAX_COUNT)
      {
         SPxOut::debug(this, "DLBFRT04 {}: no valid enterId found - relaxing...\n",
                       this->thesolver->basis().iteration());
         this->relax();
         ++relax_count;
         // restore original value
         val = max;
         // try again with relaxed delta
         return SPxBoundFlippingRT<R>::selectEnter(val, leaveIdx);
      }
      else
      {
         SPxOut::debug(this, "DLBFRT05 {}: no valid enterId found - breaking...\n",
                       this->thesolver->basis().iteration());
         return enterId;
      }
   }
   else
   {
      relax_count = 0;
      this->tighten();
   }

   // flip bounds of skipped breakpoints only if a nondegenerate step is to be performed
   if(npassedBp > 0 && spxAbs(breakpoints[npassedBp].val) > this->fastDelta)
   {
      flipAndUpdate(npassedBp);
      this->thesolver->boundflips = npassedBp;

      if(npassedBp >= 10)
         flipPotential = 1;
      else
         flipPotential -= 0.05;
   }
   else
   {
      this->thesolver->boundflips = 0;
      flipPotential -= 0.1;
   }

   SPxOut::debug(this, "DLBFRT06 {}: selected Id: {} number of candidates: {}\n",
                 this->thesolver->basis().iteration(), enterId, nBp);
   return enterId;
}